

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O2

pair<unsigned_int,_bool> __thiscall
sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::find
          (BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_> *this,
          unsigned_long_long *key)

{
  int iVar1;
  undefined4 extraout_var;
  ulong uVar3;
  uint uVar4;
  pair<unsigned_int,_bool> in_RDX;
  ulong uVar5;
  pair<unsigned_int,_bool> pVar6;
  int iVar7;
  pair<unsigned_int,_bool> pVar8;
  locType pos;
  long lVar2;
  
  iVar1 = this->depth;
  pVar6.first = 0;
  pVar6.second = false;
  pVar6._5_3_ = 0;
  if (iVar1 != 0) {
    lVar2 = this->root;
    for (iVar7 = 0; iVar7 < iVar1; iVar7 = iVar7 + 1) {
      iVar1 = (*(this->file->
                super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::node>
                )._vptr_FileManager_Base[2])();
      lVar2 = CONCAT44(extraout_var,iVar1);
      in_RDX._4_4_ = 0;
      in_RDX.first = *(uint *)(lVar2 + 0x640);
      if ((int)*(uint *)(lVar2 + 0x640) < 1) {
        in_RDX = pVar6;
      }
      pVar8.first = 0;
      pVar8.second = false;
      pVar8._5_3_ = 0;
      for (; in_RDX != pVar8; pVar8 = (pair<unsigned_int,_bool>)((long)pVar8 + 1)) {
        if (*key <= *(ulong *)(lVar2 + 0x328 + (long)pVar8 * 8)) {
          iVar1 = this->depth;
          if ((iVar7 < iVar1 + -1) && (*key < *(ulong *)(lVar2 + 0x328 + (long)pVar8 * 8))) {
            in_RDX = (pair<unsigned_int,_bool>)((ulong)pVar8 & 0xffffffff);
          }
          else {
            in_RDX = (pair<unsigned_int,_bool>)((ulong)pVar8 & 0xffffffff);
          }
          goto LAB_00107e54;
        }
      }
      iVar1 = this->depth;
LAB_00107e54:
    }
    uVar4 = in_RDX.first;
    if ((uVar4 == *(uint *)(lVar2 + 0x640)) ||
       (*key < *(ulong *)(lVar2 + 0x328 + (long)(int)uVar4 * 8))) {
      uVar5 = 0;
      uVar3 = 0;
    }
    else {
      uVar5 = (ulong)*(uint *)(lVar2 + (long)(int)uVar4 * 4);
      uVar3 = 0x100000000;
    }
    pVar6 = (pair<unsigned_int,_bool>)(uVar5 | uVar3);
  }
  return pVar6;
}

Assistant:

std::pair<T, bool> find(const Key &key) {
            T ret;
            if (!depth)return std::make_pair(ret, 0);
            locType pos = root;
            node *x;
            int i, j;
            for (i = 0; i < depth; ++i) {
                x = file->read(pos);
                for (j = 0; j < x->sz && Compare()(x->keyvalue[j], key); ++j);
                if (i < depth - 1) {
                    if (j < x->sz && !Compare()(key, x->keyvalue[j]))pos = x->pointer[j + 1];
                    else pos = x->pointer[j];
                }
            }
            if (j == x->sz || Compare()(key, x->keyvalue[j]))
                return std::make_pair(ret, false);
            ret = x->val[j];
            return std::make_pair(ret, true);
        }